

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.h
# Opt level: O2

void __thiscall trieste::detail::Make::add(Make *this,Token *type,size_t index)

{
  NodeDef *this_00;
  Location *pLVar1;
  undefined1 *local_48;
  
  if ((type->def != (TokenDef *)Group) &&
     ((((this->node).super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->type_
      ).def != (TokenDef *)Group)) {
    local_48 = Group;
    push(this,(Token *)&stack0xffffffffffffffb8,0);
  }
  this_00 = (this->node).super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pLVar1 = REMatch::at(&this->re_match,index);
  Location::Location((Location *)&stack0xffffffffffffffc0,pLVar1);
  NodeDef::create((NodeDef *)&stack0xffffffffffffffa8,type,(Location *)&stack0xffffffffffffffc0);
  NodeDef::push_back(this_00,(Node *)&stack0xffffffffffffffa8);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffb0);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc8);
  return;
}

Assistant:

void add(const Token& type, size_t index = 0)
      {
        if ((type != Group) && !in(Group))
          push(Group);

        node->push_back(NodeDef::create(type, re_match.at(index)));
      }